

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::maxF64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  bool bVar1;
  long lVar2;
  Literal *other_00;
  bool bVar3;
  Literal *this_00;
  undefined1 local_b0 [8];
  LaneArray<2> other_lanes;
  undefined1 local_68 [8];
  LaneArray<2> lanes;
  
  lanes._M_elems[1].type.id = (uintptr_t)__return_storage_ptr__;
  getLanesF64x2((LaneArray<2> *)local_68,this);
  other_00 = (Literal *)local_b0;
  getLanesF64x2((LaneArray<2> *)other_00,other);
  __return_storage_ptr___00 = &other_lanes._M_elems[1].type;
  this_00 = (Literal *)local_68;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    max((Literal *)__return_storage_ptr___00,this_00,other_00);
    ~Literal(this_00);
    Literal(this_00,(Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)__return_storage_ptr___00);
    other_00 = (Literal *)&other_lanes._M_elems[0].type;
    this_00 = (Literal *)&lanes._M_elems[0].type;
    bVar1 = false;
  } while (bVar3);
  Literal((Literal *)lanes._M_elems[1].type.id,(LaneArray<2> *)local_68);
  lVar2 = 0x18;
  do {
    ~Literal((Literal *)(local_b0 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x18;
  do {
    ~Literal((Literal *)(local_68 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return (Literal *)lanes._M_elems[1].type.id;
}

Assistant:

Literal Literal::maxF64x2(const Literal& other) const {
  return binary<2, &Literal::getLanesF64x2, &Literal::max>(*this, other);
}